

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

LPCOLESTR __thiscall
Parser::GetFunctionName(Parser *this,ParseNodeFnc *pnodeFnc,LPCOLESTR pNameHint)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  char16 *pcVar5;
  
  if (pnodeFnc->pnodeName == (ParseNodeVar *)0x0) {
    pcVar5 = (char16 *)0x0;
  }
  else {
    if ((pnodeFnc->pnodeName->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1e3d,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                         "pnodeFnc->pnodeName->nop == knopVarDecl");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pcVar5 = (char16 *)&pnodeFnc->pnodeName->pid->field_0x22;
  }
  pcVar4 = pcVar5;
  if (pcVar5 == (char16 *)0x0) {
    pcVar4 = pNameHint;
  }
  if (pNameHint == (LPCOLESTR)0x0) {
    pcVar4 = pcVar5;
  }
  if (pcVar4 == (char16 *)0x0) {
    pcVar4 = (char16 *)0x0;
    if ((pnodeFnc->fncFlags & (kFunctionIsMethod|kFunctionDeclaration)) == kFunctionNone) {
      pcVar4 = L"Anonymous function";
    }
    if ((pnodeFnc->fncFlags & kFunctionIsLambda) != kFunctionNone) {
      pcVar4 = L"Anonymous function";
    }
  }
  if (pcVar4 == (char16 *)0x0) {
    if (this->m_functionBody != (ParseableFunctionInfo *)0x0) {
      pcVar5 = Js::ParseableFunctionInfo::GetExternalDisplayName(this->m_functionBody);
      return pcVar5;
    }
    pcVar4 = L"Anonymous function";
  }
  return pcVar4;
}

Assistant:

LPCOLESTR Parser::GetFunctionName(ParseNodeFnc * pnodeFnc, LPCOLESTR pNameHint)
{
    LPCOLESTR name = nullptr;
    if (pnodeFnc->pnodeName != nullptr)
    {
        Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
        name = pnodeFnc->pnodeName->pid->Psz();
    }
    if (name == nullptr && pNameHint != nullptr)
    {
        name = pNameHint;
    }
    if (name == nullptr && (pnodeFnc->IsLambda() ||
        (!pnodeFnc->IsDeclaration() && !pnodeFnc->IsMethod())))
    {
        name = Js::Constants::AnonymousFunction;
    }
    if (name == nullptr && m_functionBody != nullptr)
    {
        name = m_functionBody->GetExternalDisplayName();
    }
    else if (name == nullptr)
    {
        name = Js::Constants::AnonymousFunction;
    }
    return name;
}